

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O0

void * crnd::crnd_get_level_data(void *pData,uint32 data_size,uint32 level_index,uint32 *pSize)

{
  uint uVar1;
  uint uVar2;
  crn_header *pcVar3;
  uint local_38;
  uint32 next_level_ofs;
  uint32 cur_level_ofs;
  crn_header *pHeader;
  uint32 *pSize_local;
  uint32 level_index_local;
  uint32 data_size_local;
  void *pData_local;
  
  if (pSize != (uint32 *)0x0) {
    *pSize = 0;
  }
  if ((pData == (void *)0x0) || (data_size < 0x3e)) {
    pData_local = (void *)0x0;
  }
  else {
    pcVar3 = crnd_get_header(pData,data_size);
    if (pcVar3 == (crn_header *)0x0) {
      pData_local = (void *)0x0;
    }
    else {
      uVar1 = crn_packed_uint::operator_cast_to_unsigned_int((crn_packed_uint *)&pcVar3->m_levels);
      if (level_index < uVar1) {
        uVar1 = crn_packed_uint::operator_cast_to_unsigned_int
                          ((crn_packed_uint *)(pcVar3->m_level_ofs + level_index));
        if (pSize != (uint32 *)0x0) {
          uVar2 = crn_packed_uint::operator_cast_to_unsigned_int
                            ((crn_packed_uint *)&pcVar3->m_levels);
          local_38 = data_size;
          if (level_index + 1 < uVar2) {
            local_38 = crn_packed_uint::operator_cast_to_unsigned_int
                                 ((crn_packed_uint *)(pcVar3->m_level_ofs + (level_index + 1)));
          }
          *pSize = local_38 - uVar1;
        }
        pData_local = (void *)((long)pData + (ulong)uVar1);
      }
      else {
        pData_local = (void *)0x0;
      }
    }
  }
  return pData_local;
}

Assistant:

const void* crnd_get_level_data(const void* pData, uint32 data_size, uint32 level_index, uint32* pSize)
    {
        if (pSize)
            *pSize = 0;

        if ((!pData) || (data_size < cCRNHeaderMinSize))
            return NULL;

        const crn_header* pHeader = crnd_get_header(pData, data_size);
        if (!pHeader)
            return NULL;

        if (level_index >= pHeader->m_levels)
            return NULL;

        uint32 cur_level_ofs = pHeader->m_level_ofs[level_index];

        if (pSize)
        {
            uint32 next_level_ofs = data_size;
            if ((level_index + 1) < (pHeader->m_levels))
                next_level_ofs = pHeader->m_level_ofs[level_index + 1];

            *pSize = next_level_ofs - cur_level_ofs;
        }

        return static_cast<const uint8*>(pData) + cur_level_ofs;
    }